

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_py_generator.cc
# Opt level: O2

string * __thiscall
t_py_generator::render_const_value_abi_cxx11_
          (string *__return_storage_ptr__,t_py_generator *this,t_type *type,t_const_value *value)

{
  int *piVar1;
  uint uVar2;
  _func_int *p_Var3;
  __type _Var4;
  bool bVar5;
  int iVar6;
  t_const_value_type tVar7;
  t_type *ttype;
  ostream *poVar8;
  _Base_ptr p_Var9;
  int64_t iVar10;
  ostringstream *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar11;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  _func_int **pp_Var12;
  pointer pptVar13;
  char *pcVar14;
  t_type *ptVar15;
  undefined1 auVar16 [12];
  string local_220;
  string *local_200;
  t_type *local_1f8;
  t_type *local_1f0;
  string local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  ostringstream out;
  
  local_200 = __return_storage_ptr__;
  ttype = t_type::get_true_type(type);
  this_00 = (ostringstream *)&out;
  std::__cxx11::ostringstream::ostringstream(this_00);
  iVar6 = (*(ttype->super_t_doc)._vptr_t_doc[5])(ttype);
  if ((char)iVar6 == '\0') {
    iVar6 = (*(ttype->super_t_doc)._vptr_t_doc[10])(ttype);
    if ((char)iVar6 == '\0') {
      iVar6 = (*(ttype->super_t_doc)._vptr_t_doc[0xb])(ttype);
      if (((char)iVar6 == '\0') &&
         (iVar6 = (*(ttype->super_t_doc)._vptr_t_doc[0xc])(ttype), (char)iVar6 == '\0')) {
        iVar6 = (*(ttype->super_t_doc)._vptr_t_doc[0x10])(ttype);
        if ((char)iVar6 == '\0') {
          iVar6 = (*(ttype->super_t_doc)._vptr_t_doc[0xe])(ttype);
          if (((char)iVar6 == '\0') &&
             (iVar6 = (*(ttype->super_t_doc)._vptr_t_doc[0xf])(ttype), (char)iVar6 == '\0')) {
            pbVar11 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      __cxa_allocate_exception(0x20);
            iVar6 = (*(ttype->super_t_doc)._vptr_t_doc[3])(ttype);
            std::operator+(pbVar11,"CANNOT GENERATE CONSTANT FOR TYPE: ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT44(extraout_var_00,iVar6));
            __cxa_throw(pbVar11,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
          }
          (*(ttype->super_t_doc)._vptr_t_doc[0xe])(ttype);
          ptVar15 = *(t_type **)&ttype[1].super_t_doc.has_doc_;
          iVar6 = (*(ttype->super_t_doc)._vptr_t_doc[0xf])(ttype);
          if ((char)iVar6 != '\0') {
            bVar5 = is_immutable(ttype);
            if (bVar5) {
              std::operator<<(&out.super_basic_ostream<char,_std::char_traits<char>_>,"frozen");
            }
            std::operator<<(&out.super_basic_ostream<char,_std::char_traits<char>_>,"set(");
          }
          bVar5 = is_immutable(ttype);
          if (bVar5) {
            pcVar14 = "(";
          }
          else {
            iVar6 = (*(ttype->super_t_doc)._vptr_t_doc[0xf])(ttype);
            pcVar14 = "[";
            if ((char)iVar6 != '\0') {
              pcVar14 = "(";
            }
          }
          poVar8 = std::operator<<(&out.super_basic_ostream<char,_std::char_traits<char>_>,pcVar14);
          std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
          piVar1 = &(this->super_t_generator).indent_;
          *piVar1 = *piVar1 + 1;
          for (pptVar13 = (value->listVal_).
                          super__Vector_base<t_const_value_*,_std::allocator<t_const_value_*>_>.
                          _M_impl.super__Vector_impl_data._M_start;
              pptVar13 !=
              (value->listVal_).
              super__Vector_base<t_const_value_*,_std::allocator<t_const_value_*>_>._M_impl.
              super__Vector_impl_data._M_finish; pptVar13 = pptVar13 + 1) {
            poVar8 = t_generator::indent(&this->super_t_generator,
                                         &out.super_basic_ostream<char,_std::char_traits<char>_>);
            render_const_value_abi_cxx11_(&local_220,this,ptVar15,*pptVar13);
            poVar8 = std::operator<<(poVar8,(string *)&local_220);
            poVar8 = std::operator<<(poVar8,",");
            std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
            std::__cxx11::string::~string((string *)&local_220);
          }
          piVar1 = &(this->super_t_generator).indent_;
          *piVar1 = *piVar1 + -1;
          bVar5 = is_immutable(ttype);
          if ((bVar5) ||
             (iVar6 = (*(ttype->super_t_doc)._vptr_t_doc[0xf])(ttype), (char)iVar6 != '\0')) {
            poVar8 = t_generator::indent(&this->super_t_generator,
                                         &out.super_basic_ostream<char,_std::char_traits<char>_>);
            pcVar14 = "Throws -> tok_throws ( FieldList )";
          }
          else {
            poVar8 = t_generator::indent(&this->super_t_generator,
                                         &out.super_basic_ostream<char,_std::char_traits<char>_>);
            pcVar14 = "ConstList => [ ConstListContents ]";
          }
          std::operator<<(poVar8,pcVar14 + 0x21);
          iVar6 = (*(ttype->super_t_doc)._vptr_t_doc[0xf])(ttype);
          if ((char)iVar6 != '\0') {
            std::operator<<(&out.super_basic_ostream<char,_std::char_traits<char>_>,")");
          }
        }
        else {
          local_1f0 = *(t_type **)&ttype[1].super_t_doc.has_doc_;
          local_1f8 = *(t_type **)&ttype[1].annotations_._M_t._M_impl;
          bVar5 = is_immutable(ttype);
          if (bVar5) {
            std::operator<<(&out.super_basic_ostream<char,_std::char_traits<char>_>,"TFrozenDict(");
          }
          poVar8 = std::operator<<(&out.super_basic_ostream<char,_std::char_traits<char>_>,"{");
          std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
          piVar1 = &(this->super_t_generator).indent_;
          *piVar1 = *piVar1 + 1;
          for (p_Var9 = (value->mapVal_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              (_Rb_tree_header *)p_Var9 != &(value->mapVal_)._M_t._M_impl.super__Rb_tree_header;
              p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9)) {
            poVar8 = t_generator::indent(&this->super_t_generator,
                                         &out.super_basic_ostream<char,_std::char_traits<char>_>);
            render_const_value_abi_cxx11_(&local_220,this,local_1f0,*(t_const_value **)(p_Var9 + 1))
            ;
            poVar8 = std::operator<<(poVar8,(string *)&local_220);
            poVar8 = std::operator<<(poVar8,": ");
            render_const_value_abi_cxx11_
                      (&local_1e8,this,local_1f8,(t_const_value *)p_Var9[1]._M_parent);
            poVar8 = std::operator<<(poVar8,(string *)&local_1e8);
            poVar8 = std::operator<<(poVar8,",");
            std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
            std::__cxx11::string::~string((string *)&local_1e8);
            std::__cxx11::string::~string((string *)&local_220);
          }
          piVar1 = &(this->super_t_generator).indent_;
          *piVar1 = *piVar1 + -1;
          poVar8 = t_generator::indent(&this->super_t_generator,
                                       &out.super_basic_ostream<char,_std::char_traits<char>_>);
          std::operator<<(poVar8,"}");
          bVar5 = is_immutable(ttype);
          if (bVar5) {
            std::operator<<(&out.super_basic_ostream<char,_std::char_traits<char>_>,")");
          }
        }
      }
      else {
        type_name_abi_cxx11_(&local_220,this,ttype);
        poVar8 = std::operator<<(&out.super_basic_ostream<char,_std::char_traits<char>_>,
                                 (string *)&local_220);
        poVar8 = std::operator<<(poVar8,"(**{");
        std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_220);
        piVar1 = &(this->super_t_generator).indent_;
        *piVar1 = *piVar1 + 1;
        for (p_Var9 = (value->mapVal_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var9 != &(value->mapVal_)._M_t._M_impl.super__Rb_tree_header;
            p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9)) {
          ptVar15 = (t_type *)0x0;
          for (pp_Var12 = ttype[1].super_t_doc._vptr_t_doc;
              pp_Var12 != (_func_int **)ttype[1].super_t_doc.doc_._M_dataplus._M_p;
              pp_Var12 = pp_Var12 + 1) {
            p_Var3 = *pp_Var12;
            std::__cxx11::string::string
                      ((string *)&local_220,(string *)(*(long *)(p_Var9 + 1) + 0x48));
            _Var4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)(p_Var3 + 0x68),&local_220);
            std::__cxx11::string::~string((string *)&local_220);
            if (_Var4) {
              ptVar15 = *(t_type **)(*pp_Var12 + 0x60);
            }
          }
          if (ptVar15 == (t_type *)0x0) {
            pbVar11 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      __cxa_allocate_exception(0x20);
            iVar6 = (*(ttype->super_t_doc)._vptr_t_doc[3])(ttype);
            std::operator+(&local_1e8,"type error: ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT44(extraout_var,iVar6));
            std::operator+(&local_220,&local_1e8," has no field ");
            std::__cxx11::string::string
                      ((string *)&local_1c8,(string *)(*(long *)(p_Var9 + 1) + 0x48));
            std::operator+(pbVar11,&local_220,&local_1c8);
            __cxa_throw(pbVar11,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
          }
          poVar8 = t_generator::indent(&this->super_t_generator,
                                       &out.super_basic_ostream<char,_std::char_traits<char>_>);
          render_const_value_abi_cxx11_
                    (&local_220,this,g_type_string,*(t_const_value **)(p_Var9 + 1));
          poVar8 = std::operator<<(poVar8,(string *)&local_220);
          poVar8 = std::operator<<(poVar8,": ");
          render_const_value_abi_cxx11_
                    (&local_1e8,this,ptVar15,(t_const_value *)p_Var9[1]._M_parent);
          poVar8 = std::operator<<(poVar8,(string *)&local_1e8);
          poVar8 = std::operator<<(poVar8,",");
          std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
          std::__cxx11::string::~string((string *)&local_1e8);
          std::__cxx11::string::~string((string *)&local_220);
        }
        piVar1 = &(this->super_t_generator).indent_;
        *piVar1 = *piVar1 + -1;
        poVar8 = t_generator::indent(&this->super_t_generator,
                                     &out.super_basic_ostream<char,_std::char_traits<char>_>);
        std::operator<<(poVar8,"})");
      }
    }
    else {
      t_const_value::get_integer(value);
      std::ostream::_M_insert<long>((long)&out);
    }
    goto LAB_00280d75;
  }
  uVar2 = *(uint *)&ttype[1].super_t_doc._vptr_t_doc;
  switch(uVar2) {
  case 1:
    iVar6 = (*(ttype->super_t_doc)._vptr_t_doc[7])(ttype);
    if ((char)iVar6 != '\0') {
      std::operator<<(&out.super_basic_ostream<char,_std::char_traits<char>_>,'b');
    }
    poVar8 = std::operator<<(&out.super_basic_ostream<char,_std::char_traits<char>_>,'\"');
    t_generator::get_escaped_string_abi_cxx11_(&local_220,&this->super_t_generator,value);
    poVar8 = std::operator<<(poVar8,(string *)&local_220);
    std::operator<<(poVar8,'\"');
    break;
  case 2:
    iVar10 = t_const_value::get_integer(value);
    pcVar14 = "False";
    if (0 < iVar10) {
      pcVar14 = "True";
    }
LAB_00280d6d:
    std::operator<<((ostream *)this_00,pcVar14);
    goto LAB_00280d75;
  case 3:
  case 4:
  case 5:
  case 6:
    t_const_value::get_integer(value);
    std::ostream::_M_insert<long>((long)&out);
    goto LAB_00280d75;
  case 7:
    tVar7 = t_const_value::get_type(value);
    if (tVar7 == CV_INTEGER) {
      poVar8 = std::operator<<(&out.super_basic_ostream<char,_std::char_traits<char>_>,"float(");
      t_const_value::get_integer(value);
      this_00 = (ostringstream *)std::ostream::_M_insert<long>((long)poVar8);
      pcVar14 = ")";
      goto LAB_00280d6d;
    }
    t_generator::emit_double_as_string_abi_cxx11_
              (&local_220,&this->super_t_generator,value->doubleVal_);
    std::operator<<(&out.super_basic_ostream<char,_std::char_traits<char>_>,(string *)&local_220);
    break;
  default:
    auVar16 = __cxa_allocate_exception(0x20);
    t_base_type::t_base_name_abi_cxx11_(&local_220,(t_base_type *)(ulong)uVar2,auVar16._8_4_);
    std::operator+(auVar16._0_8_,"compiler error: no const of base type ",&local_220);
    __cxa_throw(auVar16._0_8_,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
  }
  std::__cxx11::string::~string((string *)&local_220);
LAB_00280d75:
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&out);
  return local_200;
}

Assistant:

string t_py_generator::render_const_value(t_type* type, t_const_value* value) {
  type = get_true_type(type);
  std::ostringstream out;

  if (type->is_base_type()) {
    t_base_type::t_base tbase = ((t_base_type*)type)->get_base();
    switch (tbase) {
    case t_base_type::TYPE_STRING:
      if (((t_base_type*)type)->is_binary()) {
        out << 'b';
      }
      out << '"' << get_escaped_string(value) << '"';
      break;
    case t_base_type::TYPE_BOOL:
      out << (value->get_integer() > 0 ? "True" : "False");
      break;
    case t_base_type::TYPE_I8:
    case t_base_type::TYPE_I16:
    case t_base_type::TYPE_I32:
    case t_base_type::TYPE_I64:
      out << value->get_integer();
      break;
    case t_base_type::TYPE_DOUBLE:
      if (value->get_type() == t_const_value::CV_INTEGER) {
        out << "float(" << value->get_integer() << ")";
      } else {
        out << emit_double_as_string(value->get_double());
      }
      break;
    default:
      throw "compiler error: no const of base type " + t_base_type::t_base_name(tbase);
    }
  } else if (type->is_enum()) {
    out << value->get_integer();
  } else if (type->is_struct() || type->is_xception()) {
    out << type_name(type) << "(**{" << endl;
    indent_up();
    const vector<t_field*>& fields = ((t_struct*)type)->get_members();
    vector<t_field*>::const_iterator f_iter;
    const map<t_const_value*, t_const_value*, t_const_value::value_compare>& val = value->get_map();
    map<t_const_value*, t_const_value*, t_const_value::value_compare>::const_iterator v_iter;
    for (v_iter = val.begin(); v_iter != val.end(); ++v_iter) {
      t_type* field_type = nullptr;
      for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
        if ((*f_iter)->get_name() == v_iter->first->get_string()) {
          field_type = (*f_iter)->get_type();
        }
      }
      if (field_type == nullptr) {
        throw "type error: " + type->get_name() + " has no field " + v_iter->first->get_string();
      }
      indent(out) << render_const_value(g_type_string, v_iter->first) << ": "
          << render_const_value(field_type, v_iter->second) << "," << endl;
    }
    indent_down();
    indent(out) << "})";
  } else if (type->is_map()) {
    t_type* ktype = ((t_map*)type)->get_key_type();
    t_type* vtype = ((t_map*)type)->get_val_type();
    if (is_immutable(type)) {
      out << "TFrozenDict(";
    }
    out << "{" << endl;
    indent_up();
    const map<t_const_value*, t_const_value*, t_const_value::value_compare>& val = value->get_map();
    map<t_const_value*, t_const_value*, t_const_value::value_compare>::const_iterator v_iter;
    for (v_iter = val.begin(); v_iter != val.end(); ++v_iter) {
      indent(out) << render_const_value(ktype, v_iter->first) << ": "
          << render_const_value(vtype, v_iter->second) << "," << endl;
    }
    indent_down();
    indent(out) << "}";
    if (is_immutable(type)) {
      out << ")";
    }
  } else if (type->is_list() || type->is_set()) {
    t_type* etype;
    if (type->is_list()) {
      etype = ((t_list*)type)->get_elem_type();
    } else {
      etype = ((t_set*)type)->get_elem_type();
    }
    if (type->is_set()) {
      if (is_immutable(type)) {
        out << "frozen";
      }
      out << "set(";
    }
    if (is_immutable(type) || type->is_set()) {
      out << "(" << endl;
    } else {
      out << "[" << endl;
    }
    indent_up();
    const vector<t_const_value*>& val = value->get_list();
    vector<t_const_value*>::const_iterator v_iter;
    for (v_iter = val.begin(); v_iter != val.end(); ++v_iter) {
      indent(out) << render_const_value(etype, *v_iter) << "," << endl;
    }
    indent_down();
    if (is_immutable(type) || type->is_set()) {
      indent(out) << ")";
    } else {
      indent(out) << "]";
    }
    if (type->is_set()) {
      out << ")";
    }
  } else {
    throw "CANNOT GENERATE CONSTANT FOR TYPE: " + type->get_name();
  }

  return out.str();
}